

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetwindow.cpp
# Opt level: O1

void __thiscall QWidgetWindow::closeEvent(QWidgetWindow *this,QCloseEvent *event)

{
  Data *pDVar1;
  bool bVar2;
  QWidget *pQVar3;
  
  pDVar1 = (this->m_widget).wp.d;
  if ((pDVar1 == (Data *)0x0) || (*(int *)(pDVar1 + 4) == 0)) {
    pQVar3 = (QWidget *)0x0;
  }
  else {
    pQVar3 = (QWidget *)(this->m_widget).wp.value;
  }
  if (pQVar3 == qt_popup_down) {
    qt_popup_down = (QWidget *)0x0;
    qt_popup_down_closed = true;
  }
  bVar2 = QWidgetPrivate::handleClose
                    (*(QWidgetPrivate **)((this->m_widget).wp.value + 8),
                     CloseWithSpontaneousEvent - *(byte *)(*(long *)&this->field_0x8 + 0x93));
  (**(code **)(*(long *)event + 0x10))(event,bVar2);
  return;
}

Assistant:

void QWidgetWindow::closeEvent(QCloseEvent *event)
{
    Q_D(QWidgetWindow);
    if (qt_popup_down == m_widget) {
        qt_popup_down = nullptr;
        qt_popup_down_closed = true;
    }
    bool accepted = m_widget->d_func()->handleClose(d->inClose ? QWidgetPrivate::CloseWithEvent
                                                                  : QWidgetPrivate::CloseWithSpontaneousEvent);
    event->setAccepted(accepted);
}